

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O0

symbol * evaluate_conditional_expression(dmr_C *C,expression *expr)

{
  uint uVar1;
  uint rclass_00;
  int iVar2;
  int iVar3;
  symbol *psVar4;
  expression *peVar5;
  symbol *psVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  symbol *sym;
  int is_null2;
  int is_null1;
  int flags;
  int qual;
  char *typediff;
  int rclass;
  int lclass;
  symbol *rbase;
  symbol *lbase;
  symbol *rtype;
  symbol *ltype;
  symbol *ctype;
  expression **truee;
  expression *expr_local;
  dmr_C *C_local;
  
  truee = (expression **)expr;
  expr_local = (expression *)C;
  psVar4 = evaluate_conditional(C,(expr->field_5).field_3.unop,0);
  if (psVar4 == (symbol *)0x0) {
    return (symbol *)0x0;
  }
  psVar4 = dmrC_evaluate_expression((dmr_C *)expr_local,truee[6]);
  if (psVar4 == (symbol *)0x0) {
    return (symbol *)0x0;
  }
  ltype = degenerate((dmr_C *)expr_local,truee[4]);
  lbase = degenerate((dmr_C *)expr_local,truee[6]);
  ctype = (symbol *)(truee + 4);
  rtype = ltype;
  if (truee[5] != (expression *)0x0) {
    psVar4 = dmrC_evaluate_expression((dmr_C *)expr_local,truee[5]);
    if (psVar4 == (symbol *)0x0) {
      return (symbol *)0x0;
    }
    rtype = degenerate((dmr_C *)expr_local,truee[5]);
    ctype = (symbol *)(truee + 5);
  }
  if ((*(ushort *)truee >> 8 != 0) &&
     (((**(ushort **)ctype & *(ushort *)truee[6]) >> 8 & *(ushort *)truee[4] >> 8 & 1) == 0)) {
    *(ushort *)truee = *(ushort *)truee & 0xff;
  }
  uVar1 = classify_type((dmr_C *)expr_local,rtype,&rtype);
  rclass_00 = classify_type((dmr_C *)expr_local,lbase,&lbase);
  if ((uVar1 & rclass_00 & 1) == 0) {
    if (((uVar1 | rclass_00) & 0x10) == 0) {
      if (rtype != lbase) {
        _flags = "different base types";
        goto LAB_00111c69;
      }
      ltype = rtype;
    }
    else {
      iVar2 = is_null_pointer_constant((dmr_C *)expr_local,*(expression **)ctype);
      iVar3 = is_null_pointer_constant((dmr_C *)expr_local,truee[6]);
      if ((iVar2 == 0) || (iVar3 == 0)) {
        if ((iVar2 == 0) || ((rclass_00 & 0x10) == 0)) {
          if ((iVar3 == 0) || ((uVar1 & 0x10) == 0)) {
            if ((uVar1 & rclass_00 & 0x10) == 0) {
              _flags = "different types";
            }
            else {
              if (*(int *)((long)&rtype->field_14 + 0x30) == *(int *)((long)&lbase->field_14 + 0x30)
                 ) {
                psVar4 = dmrC_examine_pointer_target((global_symbols_t *)expr_local->pos,rtype);
                psVar6 = dmrC_examine_pointer_target((global_symbols_t *)expr_local->pos,lbase);
                uVar7 = target_qualifiers((dmr_C *)expr_local,rtype);
                uVar8 = target_qualifiers((dmr_C *)expr_local,lbase);
                uVar1 = (uint)uVar7 | (uint)uVar8;
                if (psVar4 == (symbol *)((long)expr_local->pos + 0x2c0)) {
                  ltype = rtype;
                }
                else if (psVar6 == (symbol *)((long)expr_local->pos + 0x2c0)) {
                  ltype = lbase;
                }
                else {
                  ltype = rtype;
                  _flags = dmrC_type_difference
                                     ((dmr_C *)expr_local,&(rtype->field_14).field_2.ctype,
                                      &(lbase->field_14).field_2.ctype,(long)(int)uVar1,
                                      (long)(int)uVar1);
                  if (_flags != (char *)0x0) goto LAB_00111c69;
                }
                if (((long)(int)uVar1 &
                    ((ltype->field_14).field_2.ctype.modifiers ^ 0xffffffffffffffff)) != 0) {
                  psVar4 = dmrC_alloc_symbol((global_symbols_t *)expr_local->pos,ltype->pos,4);
                  memcpy(psVar4,ltype,0xe8);
                  (psVar4->field_14).field_2.ctype.modifiers =
                       (long)(int)uVar1 | (psVar4->field_14).field_2.ctype.modifiers;
                  ltype = psVar4;
                }
                peVar5 = cast_to((dmr_C *)expr_local,*(expression **)ctype,ltype);
                *(expression **)ctype = peVar5;
                peVar5 = cast_to((dmr_C *)expr_local,truee[6],ltype);
                truee[6] = peVar5;
                goto LAB_00111cd4;
              }
              _flags = "different address spaces";
            }
LAB_00111c69:
            dmrC_expression_error
                      ((dmr_C *)expr_local,(expression *)truee,
                       "incompatible types in conditional expression (%s)",_flags);
            iVar2 = dmrC_expr_truth_value((dmr_C *)expr_local,truee[4]);
            if (iVar2 == 0) {
              truee[2] = (expression *)lbase;
            }
            else if (iVar2 == 1) {
              truee[2] = (expression *)rtype;
            }
            return (symbol *)0x0;
          }
          if (iVar3 == 2) {
            bad_null((dmr_C *)expr_local,truee[6]);
          }
          peVar5 = cast_to((dmr_C *)expr_local,truee[6],rtype);
          truee[6] = peVar5;
          ltype = rtype;
        }
        else {
          if (iVar2 == 2) {
            bad_null((dmr_C *)expr_local,*(expression **)ctype);
          }
          peVar5 = cast_to((dmr_C *)expr_local,*(expression **)ctype,lbase);
          *(expression **)ctype = peVar5;
          ltype = lbase;
        }
      }
      else {
        peVar5 = cast_to((dmr_C *)expr_local,*(expression **)ctype,
                         (symbol *)((long)expr_local->pos + 0x1880));
        *(expression **)ctype = peVar5;
        peVar5 = cast_to((dmr_C *)expr_local,truee[6],(symbol *)((long)expr_local->pos + 0x1880));
        truee[6] = peVar5;
        ltype = (symbol *)((long)expr_local->pos + 0x1880);
      }
    }
  }
  else {
    ltype = usual_conversions((dmr_C *)expr_local,0x3f,*(expression **)ctype,truee[6],uVar1,
                              rclass_00,rtype,lbase);
    peVar5 = cast_to((dmr_C *)expr_local,*(expression **)ctype,ltype);
    *(expression **)ctype = peVar5;
    peVar5 = cast_to((dmr_C *)expr_local,truee[6],ltype);
    truee[6] = peVar5;
  }
LAB_00111cd4:
  truee[2] = (expression *)ltype;
  return ltype;
}

Assistant:

static struct symbol *evaluate_conditional_expression(struct dmr_C *C, struct expression *expr)
{
	struct expression **truee;
	struct symbol *ctype, *ltype, *rtype, *lbase, *rbase;
	int lclass, rclass;
	const char * typediff;
	int qual;

	if (!evaluate_conditional(C, expr->conditional, 0))
		return NULL;
	if (!dmrC_evaluate_expression(C, expr->cond_false))
		return NULL;

	ctype = degenerate(C, expr->conditional);
	rtype = degenerate(C, expr->cond_false);

	truee = &expr->conditional;
	ltype = ctype;
	if (expr->cond_true) {
		if (!dmrC_evaluate_expression(C, expr->cond_true))
			return NULL;
		ltype = degenerate(C, expr->cond_true);
		truee = &expr->cond_true;
	}

	if (expr->flags) {
		int flags = expr->conditional->flags & Int_const_expr;
		flags &= (*truee)->flags & expr->cond_false->flags;
		if (!flags)
			expr->flags = 0;
	}

	lclass = classify_type(C, ltype, &ltype);
	rclass = classify_type(C, rtype, &rtype);
	if (lclass & rclass & TYPE_NUM) {
		ctype = usual_conversions(C, '?', *truee, expr->cond_false,
					  lclass, rclass, ltype, rtype);
		*truee = cast_to(C, *truee, ctype);
		expr->cond_false = cast_to(C, expr->cond_false, ctype);
		goto out;
	}

	if ((lclass | rclass) & TYPE_PTR) {
		int is_null1 = is_null_pointer_constant(C, *truee);
		int is_null2 = is_null_pointer_constant(C, expr->cond_false);

		if (is_null1 && is_null2) {
			*truee = cast_to(C, *truee, &C->S->ptr_ctype);
			expr->cond_false = cast_to(C, expr->cond_false, &C->S->ptr_ctype);
			ctype = &C->S->ptr_ctype;
			goto out;
		}
		if (is_null1 && (rclass & TYPE_PTR)) {
			if (is_null1 == 2)
				bad_null(C, *truee);
			*truee = cast_to(C, *truee, rtype);
			ctype = rtype;
			goto out;
		}
		if (is_null2 && (lclass & TYPE_PTR)) {
			if (is_null2 == 2)
				bad_null(C, expr->cond_false);
			expr->cond_false = cast_to(C, expr->cond_false, ltype);
			ctype = ltype;
			goto out;
		}
		if (!(lclass & rclass & TYPE_PTR)) {
			typediff = "different types";
			goto Err;
		}
		/* OK, it's pointer on pointer */
		if (ltype->ctype.as != rtype->ctype.as) {
			typediff = "different address spaces";
			goto Err;
		}

		/* need to be lazier here */
		lbase = dmrC_examine_pointer_target(C->S, ltype);
		rbase = dmrC_examine_pointer_target(C->S, rtype);
		qual = target_qualifiers(C, ltype) | target_qualifiers(C, rtype);

		if (lbase == &C->S->void_ctype) {
			/* XXX: pointers to function should warn here */
			ctype = ltype;
			goto Qual;

		}
		if (rbase == &C->S->void_ctype) {
			/* XXX: pointers to function should warn here */
			ctype = rtype;
			goto Qual;
		}
		/* XXX: that should be pointer to composite */
		ctype = ltype;
		typediff = dmrC_type_difference(C, &ltype->ctype, &rtype->ctype,
					   qual, qual);
		if (!typediff)
			goto Qual;
		goto Err;
	}

	/* void on void, struct on same struct, union on same union */
	if (ltype == rtype) {
		ctype = ltype;
		goto out;
	}
	typediff = "different base types";

Err:
	dmrC_expression_error(C, expr, "incompatible types in conditional expression (%s)", typediff);
	/*
	 * if the condition is constant, the type is in fact known
	 * so use it, as gcc & clang do.
	 */
	switch (dmrC_expr_truth_value(C, expr->conditional)) {
	case 1:	expr->ctype = ltype;
		break;
	case 0: expr->ctype = rtype;
		break;
	default:
		break;
	}
	return NULL;

out:
	expr->ctype = ctype;
	return ctype;

Qual:
	if (qual & ~ctype->ctype.modifiers) {
		struct symbol *sym = dmrC_alloc_symbol(C->S, ctype->pos, SYM_PTR);
		*sym = *ctype;
		sym->ctype.modifiers |= qual;
		ctype = sym;
	}
	*truee = cast_to(C, *truee, ctype);
	expr->cond_false = cast_to(C, expr->cond_false, ctype);
	goto out;
}